

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

App * __thiscall
CLI::App::_find_subcommand(App *this,string *subc_name,bool ignore_disabled,bool ignore_used)

{
  bool bVar1;
  element_type *peVar2;
  ulong uVar3;
  App *pAVar4;
  element_type *peVar5;
  string local_70;
  undefined8 local_50;
  App *subc;
  App_p *com;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range2;
  bool ignore_used_local;
  bool ignore_disabled_local;
  string *subc_name_local;
  App *this_local;
  
  __end2 = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
           begin(&this->subcommands_);
  com = (App_p *)std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                 ::end(&this->subcommands_);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                                *)&com);
    if (!bVar1) {
      return (App *)0x0;
    }
    subc = (App *)__gnu_cxx::
                  __normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                  ::operator*(&__end2);
    peVar2 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        subc);
    if (((peVar2->disabled_ & 1U) == 0) || (!ignore_disabled)) {
      peVar2 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )subc);
      get_name_abi_cxx11_(peVar2);
      uVar3 = ::std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        peVar2 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)subc);
        pAVar4 = _find_subcommand(peVar2,subc_name,ignore_disabled,ignore_used);
        if (pAVar4 != (App *)0x0) {
          return pAVar4;
        }
        local_50 = 0;
      }
      peVar2 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )subc);
      ::std::__cxx11::string::string((string *)&local_70,(string *)subc_name);
      bVar1 = check_name(peVar2,&local_70);
      ::std::__cxx11::string::~string((string *)&local_70);
      if (bVar1) {
        peVar2 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator*((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)subc);
        bVar1 = operator_cast_to_bool(peVar2);
        if ((!bVar1) || (!ignore_used)) {
          peVar5 = std::__shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>::get
                             ((__shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2> *)subc);
          return peVar5;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

App *_find_subcommand(const std::string &subc_name, bool ignore_disabled, bool ignore_used) const noexcept {
        for(const App_p &com : subcommands_) {
            if(com->disabled_ && ignore_disabled)
                continue;
            if(com->get_name().empty()) {
                auto subc = com->_find_subcommand(subc_name, ignore_disabled, ignore_used);
                if(subc != nullptr) {
                    return subc;
                }
            }
            if(com->check_name(subc_name)) {
                if((!*com) || !ignore_used)
                    return com.get();
            }
        }
        return nullptr;
    }